

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int usernameIsRegistered(char *u)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char enc_pass [30];
  char username [30];
  char line [50];
  undefined1 auStack_a8 [32];
  char local_88 [32];
  char local_68 [56];
  
  pthread_mutex_lock((pthread_mutex_t *)&users_lock_g);
  __stream = fopen(USER_FILE,"r");
  if (__stream == (FILE *)0x0) {
LAB_0010395c:
    pthread_mutex_unlock((pthread_mutex_t *)&users_lock_g);
    iVar1 = 0;
  }
  else {
    do {
      pcVar2 = fgets(local_68,0x32,__stream);
      if (pcVar2 == (char *)0x0) {
        fclose(__stream);
        goto LAB_0010395c;
      }
      __isoc99_sscanf(local_68,"%s %s\n",local_88,auStack_a8);
      iVar1 = strcmp(u,local_88);
    } while (iVar1 != 0);
    fclose(__stream);
    pthread_mutex_unlock((pthread_mutex_t *)&users_lock_g);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int 
usernameIsRegistered(char* u)
{
    char username[30];
    char enc_pass[30];
    char line[50];

    // locking shared resource
    pthread_mutex_lock(&users_lock_g);

    FILE* users_file;

    users_file = fopen(USER_FILE, "r");
    if(users_file == NULL) {
        pthread_mutex_unlock(&users_lock_g);
        return 0;       // no file exists, hence no username exists, gr8
    }

    // check whether the user is already in the file (= already registered)
    while(fgets(line, sizeof(line), users_file)) {
        sscanf(line, "%s %s\n", username, enc_pass);
        
        // checking whether `u` (i.e. username coming from the client) 
        // matches `username` (i.e. username saved on the file in the server)
        if (strcmp(u, username) == 0){
            fclose(users_file);
            
            // unlocking shared resource before going returning to caller
            pthread_mutex_unlock(&users_lock_g);
            return 1;   // found user in the file
        }
    }

    fclose(users_file);

    // unlocking shared resource before going returning to caller
    pthread_mutex_unlock(&users_lock_g);
    
    return 0;           // username `u` is new to the system, hence the registration can proceed.
}